

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

Error * ot::commissioner::PendingDatasetFromJson
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,string *aJson)

{
  string *this;
  pointer puVar1;
  Timestamp TVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  Timestamp TVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *to;
  char *from;
  bool bVar5;
  format_args args;
  Json json;
  writer write;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  undefined1 local_190 [32];
  json_value local_170 [8];
  undefined1 local_168 [40];
  _Alloc_hider local_140;
  char local_130 [16];
  Channel local_120;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_118;
  pointer local_100;
  pointer puStack_f8;
  pointer local_f0;
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  pointer local_d0;
  pointer puStack_c8;
  pointer local_c0;
  uint16_t local_b8;
  pointer local_b0;
  pointer puStack_a8;
  pointer local_a0;
  uint16_t local_98;
  undefined8 local_94;
  undefined4 local_8c;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  writer local_38;
  
  __return_storage_ptr__->mCode = kNone;
  local_60 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_60;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_168);
  TVar2._4_4_ = local_168._4_4_;
  TVar2._0_4_ = local_168._0_4_;
  (aDataset->super_ActiveOperationalDataset).mActiveTimestamp = TVar2;
  puVar1 = (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_168._8_8_;
  (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_168._16_8_;
  (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_168._24_8_;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = (pointer)0x0;
  local_168._24_8_ = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (aDataset->super_ActiveOperationalDataset).mPanId = local_168._32_2_;
  this = &(aDataset->super_ActiveOperationalDataset).mNetworkName;
  std::__cxx11::string::operator=((string *)this,(string *)&local_140);
  (aDataset->super_ActiveOperationalDataset).mChannel = local_120;
  local_1a8 = (undefined1  [8])
              (aDataset->super_ActiveOperationalDataset).mChannelMask.
              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
  _Stack_1a0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (aDataset->super_ActiveOperationalDataset).mChannelMask.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198 = (aDataset->super_ActiveOperationalDataset).mChannelMask.
              super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (aDataset->super_ActiveOperationalDataset).mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_118.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_118.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (aDataset->super_ActiveOperationalDataset).mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.
       super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_118.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           *)local_1a8);
  puVar1 = (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_100;
  (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_f8;
  (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_f0;
  local_f0 = (pointer)0x0;
  local_100 = (pointer)0x0;
  puStack_f8 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_e8;
  (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_e0;
  (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_d8;
  local_e8 = (pointer)0x0;
  puStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (aDataset->super_ActiveOperationalDataset).mPSKc.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mPSKc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d0;
  (aDataset->super_ActiveOperationalDataset).mPSKc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_c8;
  (aDataset->super_ActiveOperationalDataset).mPSKc.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_c0;
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mRotationTime = local_b8;
  puVar1 = (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_b0;
  (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_a8;
  (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_a0;
  local_b0 = (pointer)0x0;
  puStack_a8 = (pointer)0x0;
  local_a0 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (aDataset->super_ActiveOperationalDataset).mPresentFlags = local_98;
  *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4 = local_8c;
  *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4 = local_94;
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0);
  }
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0);
  }
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8);
  }
  if (local_100 != (pointer)0x0) {
    operator_delete(local_100);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_118);
  if (local_140._M_p != local_130) {
    operator_delete(local_140._M_p);
  }
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._8_8_);
  }
  StripComments((string *)local_168,aJson);
  first._M_current._4_4_ = local_168._4_4_;
  first._M_current._0_4_ = local_168._0_4_;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_1a8,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_168._8_8_ + first._M_current));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)(local_190 + 0x18),(input_adapter *)local_1a8,(parser_callback_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((pointer)_Stack_1a0._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
  if ((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_) != local_168 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_168._4_4_,local_168._0_4_));
  }
  if (local_190[0x18] == null) {
    local_168._0_4_ = none_type;
    from = "Empty pending operational dataset from JSON";
    local_168._8_8_ = "Empty pending operational dataset from JSON";
    local_168._16_8_ = (pointer)0x2b;
    local_168._24_8_ = (pointer)0x0;
    local_140._M_p = (char *)0x0;
    local_168._32_8_ = (format_string_checker<char> *)local_168;
    local_38.handler_ = (format_string_checker<char> *)local_168;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_0027b0c7:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",(format_string_checker<char> *)local_168);
        bVar5 = true;
      }
      else {
        to = from + 1;
        bVar5 = to != "";
        if (bVar5) {
          if (*to != '{') {
            pcVar4 = from + 2;
            do {
              to = pcVar4;
              bVar5 = to != "";
              if (to == "") goto LAB_0027b0c3;
              pcVar4 = to + 1;
            } while (*to != '{');
          }
          bVar5 = true;
        }
LAB_0027b0c3:
        if (bVar5) goto LAB_0027b0c7;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_38,from,"");
        bVar5 = false;
      }
    } while (bVar5);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_168;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_80,(v10 *)"Empty pending operational dataset from JSON",
               (string_view)ZEXT816(0x2b),args);
    local_1a8._0_4_ = 5;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_1a0,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    __return_storage_ptr__->mCode = local_1a8._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&_Stack_1a0);
    if ((pointer)_Stack_1a0._M_pi != (pointer)local_190) {
      operator_delete(_Stack_1a0._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0027b019;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<ot::commissioner::PendingOperationalDataset,_ot::commissioner::PendingOperationalDataset,_0>
              ((PendingOperationalDataset *)local_168,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(local_190 + 0x18));
    TVar3._4_4_ = local_168._4_4_;
    TVar3._0_4_ = local_168._0_4_;
    (aDataset->super_ActiveOperationalDataset).mActiveTimestamp = TVar3;
    puVar1 = (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_168._8_8_;
    (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_168._16_8_;
    (aDataset->super_ActiveOperationalDataset).mExtendedPanId.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_168._24_8_;
    local_168._8_8_ = (pointer)0x0;
    local_168._16_8_ = (pointer)0x0;
    local_168._24_8_ = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    (aDataset->super_ActiveOperationalDataset).mPanId = local_168._32_2_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_140);
    (aDataset->super_ActiveOperationalDataset).mChannel = local_120;
    local_1a8 = (undefined1  [8])
                (aDataset->super_ActiveOperationalDataset).mChannelMask.
                super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
    _Stack_1a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (aDataset->super_ActiveOperationalDataset).mChannelMask.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_198 = (aDataset->super_ActiveOperationalDataset).mChannelMask.
                super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (aDataset->super_ActiveOperationalDataset).mChannelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_118.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mChannelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_118.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (aDataset->super_ActiveOperationalDataset).mChannelMask.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_118.
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_118.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
               *)local_1a8);
    puVar1 = (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_100;
    (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_f8;
    (aDataset->super_ActiveOperationalDataset).mMeshLocalPrefix.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_f0;
    local_f0 = (pointer)0x0;
    local_100 = (pointer)0x0;
    puStack_f8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_e8;
    (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_e0;
    (aDataset->super_ActiveOperationalDataset).mNetworkMasterKey.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_d8;
    local_e8 = (pointer)0x0;
    puStack_e0 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    puVar1 = (aDataset->super_ActiveOperationalDataset).mPSKc.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mPSKc.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_d0;
    (aDataset->super_ActiveOperationalDataset).mPSKc.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_c8;
    (aDataset->super_ActiveOperationalDataset).mPSKc.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_c0;
    local_d0 = (pointer)0x0;
    puStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mRotationTime = local_b8;
    puVar1 = (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_b0;
    (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_a8;
    (aDataset->super_ActiveOperationalDataset).mSecurityPolicy.mFlags.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_a0;
    local_b0 = (pointer)0x0;
    puStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    (aDataset->super_ActiveOperationalDataset).mPresentFlags = local_98;
    *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4 = local_8c;
    *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4 = local_94;
    if (local_b0 != (pointer)0x0) {
      operator_delete(local_b0);
    }
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0);
    }
    if (local_e8 != (pointer)0x0) {
      operator_delete(local_e8);
    }
    if (local_100 != (pointer)0x0) {
      operator_delete(local_100);
    }
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_118);
    if (local_140._M_p != local_130) {
      operator_delete(local_140._M_p);
    }
    local_80._M_dataplus._M_p = (pointer)local_168._8_8_;
    if ((pointer)local_168._8_8_ == (pointer)0x0) goto LAB_0027b019;
  }
  operator_delete(local_80._M_dataplus._M_p);
LAB_0027b019:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)(local_190 + 0x18));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(local_170,local_190[0x18]);
  return __return_storage_ptr__;
}

Assistant:

Error PendingDatasetFromJson(PendingOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = PendingOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty pending operational dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}